

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O2

void __thiscall
uWS::WebSocketHandshake::static_for<15,_uWS::WebSocketHandshake::Sha1Loop<1>_>::operator()
          (static_for<15,_uWS::WebSocketHandshake::Sha1Loop<1>_> *this,uint32_t *a,uint32_t *b)

{
  static_for<14,_uWS::WebSocketHandshake::Sha1Loop<1>_> local_11;
  
  static_for<14,_uWS::WebSocketHandshake::Sha1Loop<1>_>::operator()(&local_11,a,b);
  Sha1Loop<1>::f<14>(a,b);
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }